

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O0

void test_single<unsigned_int>(void)

{
  bool bVar1;
  __type _Var2;
  uint uVar3;
  ostream *poVar4;
  runtime_error *this;
  ostringstream oss;
  ostringstream b;
  ostringstream a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  string local_5c0 [32];
  string local_5a0 [39];
  undefined1 local_579;
  string local_578 [32];
  ostringstream local_558 [376];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  uint local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  ostringstream local_2f0 [376];
  ostringstream local_178 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_178);
  std::__cxx11::ostringstream::ostringstream(local_2f0);
  std::numeric_limits<unsigned_int>::min();
  local_300 = (uint)cppcms::impl::cint<unsigned_int>(0x103f1f);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  std::numeric_limits<unsigned_int>::max();
  local_304 = (uint)cppcms::impl::cint<unsigned_int>(0x103f7f);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_308 = (uint)cppcms::impl::cint<unsigned_int>(0x103fdd);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_30c = (uint)cppcms::impl::cint<unsigned_int>(0x104038);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_310 = (uint)cppcms::impl::cint<unsigned_int>(0x104096);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_314 = (uint)cppcms::impl::cint<unsigned_int>(0x1040f4);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_318 = (uint)cppcms::impl::cint<unsigned_int>(0x104152);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_31c = (uint)cppcms::impl::cint<unsigned_int>(0x1041b0);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  local_320 = (uint)cppcms::impl::cint<unsigned_int>(0x10420e);
  poVar4 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff870,
                      (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffff868);
  std::operator<<(poVar4," ");
  uVar3 = std::numeric_limits<unsigned_int>::min();
  poVar4 = (ostream *)std::ostream::operator<<(local_2f0,uVar3);
  poVar4 = std::operator<<(poVar4," ");
  uVar3 = std::numeric_limits<unsigned_int>::max();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xffffffff);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xfffffff6);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3039);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xffffcfc7);
  std::operator<<(poVar4," ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator!=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_340);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error!!! \n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_380);
    poVar4 = std::operator<<(poVar4,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_3a0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_3c0);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream(local_558);
      poVar4 = std::operator<<((ostream *)local_558,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
      std::operator<<(poVar4," a.str() == b.str()");
      local_579 = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this,local_578);
      local_579 = 0;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Ok       \n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_5a0);
    poVar4 = std::operator<<(poVar4,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar4 = std::operator<<(poVar4,local_5c0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_5c0);
    std::__cxx11::string::~string(local_5a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_2f0);
  std::__cxx11::ostringstream::~ostringstream(local_178);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}